

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

void learn_bandit_adf(warm_cb *data,multi_learner *base,example *ec,int ec_type)

{
  reference ppeVar1;
  reference pvVar2;
  example *in_RDI;
  warm_cb *unaff_retaddr;
  size_t a_2;
  size_t a_1;
  float weight_multiplier;
  uint32_t i;
  size_t a;
  vector<float,_std::allocator<float>_> old_weights;
  label *lab;
  cb_class *cl;
  cb_class *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  value_type vVar3;
  float in_stack_ffffffffffffff84;
  vector<example_*,_std::allocator<example_*>_> *in_stack_ffffffffffffff88;
  ulong __n;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float fVar4;
  undefined4 in_stack_ffffffffffffffa4;
  ulong local_50;
  vector<float,_std::allocator<float>_> local_48;
  polylabel *local_30;
  float **local_28;
  
  copy_example_to_adf(unaff_retaddr,in_RDI);
  local_28 = &(in_RDI->super_example_predict).feature_space[2].values.end_array;
  ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      ((vector<example_*,_std::allocator<example_*>_> *)
                       &(in_RDI->super_example_predict).feature_space[0].indicies.erase_count,
                       (ulong)(*(int *)((long)&(in_RDI->super_example_predict).feature_space[2].
                                               values.end_array + 4) - 1));
  local_30 = &(*ppeVar1)->l;
  v_array<CB::cb_class>::push_back
            ((v_array<CB::cb_class> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x292179);
  for (local_50 = 0;
      local_50 < *(uint *)&(in_RDI->super_example_predict).feature_space[1].indicies._begin;
      local_50 = local_50 + 1) {
    std::vector<example_*,_std::allocator<example_*>_>::operator[]
              ((vector<example_*,_std::allocator<example_*>_> *)
               &(in_RDI->super_example_predict).feature_space[0].indicies.erase_count,local_50);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff90,
               (value_type_conflict3 *)in_stack_ffffffffffffff88);
  }
  for (fVar4 = 0.0; (uint)fVar4 < (uint)(in_RDI->super_example_predict).feature_space[0].sum_feat_sq
      ; fVar4 = (float)((int)fVar4 + 1)) {
    in_stack_ffffffffffffff9c =
         compute_weight_multiplier
                   ((warm_cb *)CONCAT44(in_stack_ffffffffffffffa4,fVar4),
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    for (in_stack_ffffffffffffff90 =
              (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
        in_stack_ffffffffffffff90 <
        (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
        (ulong)*(uint *)&(in_RDI->super_example_predict).feature_space[1].indicies._begin;
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_48,(size_type)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff84 = *pvVar2 * in_stack_ffffffffffffff9c;
      ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          ((vector<example_*,_std::allocator<example_*>_> *)
                           &(in_RDI->super_example_predict).feature_space[0].indicies.erase_count,
                           (size_type)in_stack_ffffffffffffff90);
      (*ppeVar1)->weight = in_stack_ffffffffffffff84;
    }
    LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  for (__n = 0; __n < *(uint *)&(in_RDI->super_example_predict).feature_space[1].indicies._begin;
      __n = __n + 1) {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_48,__n);
    vVar3 = *pvVar2;
    ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        ((vector<example_*,_std::allocator<example_*>_> *)
                         &(in_RDI->super_example_predict).feature_space[0].indicies.erase_count,__n)
    ;
    (*ppeVar1)->weight = vVar3;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

void learn_bandit_adf(warm_cb& data, multi_learner& base, example& ec, int ec_type)
{
	copy_example_to_adf(data, ec);

  // add cb label to chosen action
	auto& cl = data.cl_adf;
  auto& lab = data.ecs[cl.action - 1]->l.cb;
  lab.costs.push_back(cl);

	vector<float> old_weights;
	for (size_t a = 0; a < data.num_actions; ++a)
		old_weights.push_back(data.ecs[a]->weight);

	for (uint32_t i = 0; i < data.choices_lambda; i++)
	{
		float weight_multiplier = compute_weight_multiplier(data, i, ec_type);
	  for (size_t a = 0; a < data.num_actions; ++a)
			data.ecs[a]->weight = old_weights[a] * weight_multiplier;
	  base.learn(data.ecs, i);
	}

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->weight = old_weights[a];
}